

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::ChaiScript_Basic::do_eval
          (ChaiScript_Basic *this,string *t_input,string *t_filename,bool param_3)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Boxed_Value BVar3;
  long *local_40;
  Dispatch_State local_38;
  
  (*(code *)**(undefined8 **)t_input[9]._M_string_length)(&local_40);
  plVar1 = local_40;
  detail::Dispatch_State::Dispatch_State(&local_38,(Dispatch_Engine *)&t_input[9].field_2);
  (**(code **)(*plVar1 + 8))(this,plVar1,&local_38);
  _Var2._M_pi = extraout_RDX;
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 0x18))();
    _Var2._M_pi = extraout_RDX_00;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_eval(const std::string &t_input, const std::string &t_filename = "__EVAL__", bool /* t_internal*/ = false) {
      try {
        const auto p = m_parser->parse(t_input, t_filename);
        return p->eval(chaiscript::detail::Dispatch_State(m_engine));
      } catch (chaiscript::eval::detail::Return_Value &rv) {
        return rv.retval;
      }
    }